

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

BOOL UTIL_IsReadOnlyBitsSet(stat *stat_data)

{
  __uid_t _Var1;
  __gid_t _Var2;
  __uid_t _Var3;
  __gid_t _Var4;
  bool bVar5;
  
  _Var1 = stat_data->st_uid;
  _Var3 = geteuid();
  if (_Var1 == _Var3) {
    bVar5 = (stat_data->st_mode & 0x180) == 0x100;
  }
  else {
    _Var2 = stat_data->st_gid;
    _Var4 = getegid();
    if (_Var2 == _Var4) {
      bVar5 = (stat_data->st_mode & 0x30) == 0x20;
    }
    else {
      bVar5 = (stat_data->st_mode & 6) == 4;
    }
  }
  return (BOOL)bVar5;
}

Assistant:

BOOL UTIL_IsReadOnlyBitsSet( struct stat * stat_data )
{
    BOOL bRetVal = FALSE;

    /* Check for read permissions. */
    if ( stat_data->st_uid == geteuid() )
    {
        /* The process owner is the file owner as well. */
        if ( ( stat_data->st_mode & S_IRUSR ) && !( stat_data->st_mode & S_IWUSR ) )
        {
            bRetVal = TRUE;
        }
    }
    else if ( stat_data->st_gid == getegid() )
    {
        /* The process's owner is in the same group as the file's owner. */
        if ( ( stat_data->st_mode & S_IRGRP ) && !( stat_data->st_mode & S_IWGRP ) )
        {
            bRetVal = TRUE;
        }
    }
    else
    {
        /* Check the other bits to see who can access the file. */
        if ( ( stat_data->st_mode & S_IROTH ) && !( stat_data->st_mode & S_IWOTH ) )
        {
            bRetVal = TRUE;
        }
    }

    return bRetVal;
}